

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Responses.cpp
# Opt level: O3

Response __thiscall
Response::topology(Response *this,vector<DatasetEntry,_std::allocator<DatasetEntry>_> *datasets)

{
  value_t vVar1;
  pointer pIVar2;
  json_value jVar3;
  reference pvVar4;
  json_value extraout_RDX;
  pointer key;
  pointer pIVar5;
  Response RVar6;
  json index_entry;
  string type_name;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  indexes;
  undefined1 local_108 [8];
  json_value local_100;
  value_t local_f8;
  json_value local_f0;
  value_t local_e8;
  json_value local_e0;
  value_t local_d8;
  json_value local_d0;
  value_t local_c8;
  json_value local_c0;
  value_t local_b8;
  json_value local_b0;
  _Base_ptr local_a8;
  json_value local_a0;
  undefined1 local_98 [16];
  _Rb_tree_node_base local_88;
  pointer local_60;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_58;
  undefined1 local_40 [8];
  json_value local_38;
  
  local_98._0_8_ = &local_88;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"topology","");
  Response(this,(string *)local_98);
  if ((_Rb_tree_node_base *)local_98._0_8_ != &local_88) {
    operator_delete((void *)local_98._0_8_,local_88._0_8_ + 1);
  }
  local_a8 = (_Base_ptr)(local_98 + 8);
  local_88._0_8_ = 0;
  local_98._0_8_ = (_Rb_tree_node_base *)0x0;
  local_98._8_8_ = 0;
  local_88._M_right = (_Base_ptr)0x0;
  local_108[0] = object;
  local_88._M_parent = local_a8;
  local_88._M_left = local_a8;
  local_58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_a8;
  local_100.object =
       nlohmann::
       basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
       ::
       create<std::map<std::__cxx11::string,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>>,std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                 ((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_58,
                  (_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_a8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_98);
  key = (datasets->super__Vector_base<DatasetEntry,_std::allocator<DatasetEntry>_>)._M_impl.
        super__Vector_impl_data._M_start;
  local_60 = (datasets->super__Vector_base<DatasetEntry,_std::allocator<DatasetEntry>_>)._M_impl.
             super__Vector_impl_data._M_finish;
  if (key != local_60) {
    do {
      local_58.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_58.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_58.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pIVar2 = (key->indexes).super__Vector_base<IndexEntry,_std::allocator<IndexEntry>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (pIVar5 = (key->indexes).super__Vector_base<IndexEntry,_std::allocator<IndexEntry>_>.
                    _M_impl.super__Vector_impl_data._M_start; pIVar5 != pIVar2; pIVar5 = pIVar5 + 1)
      {
        get_index_type_name_abi_cxx11_((string *)local_98,pIVar5->type);
        local_a8 = (_Base_ptr)((ulong)local_a8 & 0xffffffffffffff00);
        local_a0.object = (object_t *)0x0;
        local_d0.object = (object_t *)0x0;
        local_d8 = string;
        local_d0.object =
             (object_t *)
             nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
             ::create<std::__cxx11::string,std::__cxx11::string_const&>((string *)local_98);
        pvVar4 = nlohmann::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                 ::operator[]<char_const>
                           ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                             *)&local_a8,"type");
        vVar1 = pvVar4->m_type;
        pvVar4->m_type = local_d8;
        jVar3 = pvVar4->m_value;
        (pvVar4->m_value).object = (object_t *)local_d0;
        local_d8 = vVar1;
        local_d0 = jVar3;
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::json_value::destroy((json_value *)&local_d0.boolean,vVar1);
        local_e0 = (json_value)pIVar5->size;
        local_e8 = number_unsigned;
        pvVar4 = nlohmann::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                 ::operator[]<char_const>
                           ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                             *)&local_a8,"size");
        vVar1 = pvVar4->m_type;
        pvVar4->m_type = local_e8;
        jVar3 = pvVar4->m_value;
        pvVar4->m_value = local_e0;
        local_e8 = vVar1;
        local_e0 = jVar3;
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::json_value::destroy((json_value *)&local_e0.boolean,vVar1);
        pvVar4 = nlohmann::
                 basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                 ::operator[]((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                               *)local_108,&key->id);
        pvVar4 = nlohmann::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                 ::operator[]<char_const>
                           ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                             *)pvVar4,"indexes");
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::push_back(pvVar4,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                            *)&local_a8);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::json_value::destroy((json_value *)&local_a0.boolean,(value_t)local_a8);
        if ((_Rb_tree_node_base *)local_98._0_8_ != &local_88) {
          operator_delete((void *)local_98._0_8_,local_88._0_8_ + 1);
        }
      }
      local_b0 = (json_value)key->size;
      local_b8 = number_unsigned;
      pvVar4 = nlohmann::
               basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
               ::operator[]((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                             *)local_108,&key->id);
      pvVar4 = nlohmann::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                           *)pvVar4,"size");
      vVar1 = pvVar4->m_type;
      pvVar4->m_type = local_b8;
      jVar3 = pvVar4->m_value;
      pvVar4->m_value = local_b0;
      local_b8 = vVar1;
      local_b0 = jVar3;
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::json_value::destroy((json_value *)&local_b0.boolean,vVar1);
      local_c0 = (json_value)key->file_count;
      local_c8 = number_unsigned;
      pvVar4 = nlohmann::
               basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
               ::operator[]((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                             *)local_108,&key->id);
      pvVar4 = nlohmann::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                           *)pvVar4,"file_count");
      vVar1 = pvVar4->m_type;
      pvVar4->m_type = local_c8;
      jVar3 = pvVar4->m_value;
      pvVar4->m_value = local_c0;
      local_c8 = vVar1;
      local_c0 = jVar3;
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::json_value::destroy((json_value *)&local_c0.boolean,vVar1);
      local_f0.object = (object_t *)0x0;
      local_f8 = array;
      local_98._0_8_ = (key->taints)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      local_a8 = &(key->taints)._M_t._M_impl.super__Rb_tree_header._M_header;
      local_f0.object =
           (object_t *)
           nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
           ::
           create<std::vector<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,std::allocator<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>,std::_Rb_tree_const_iterator<std::__cxx11::string>,std::_Rb_tree_const_iterator<std::__cxx11::string>>
                     ((_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)local_98,
                      (_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_a8);
      pvVar4 = nlohmann::
               basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
               ::operator[]((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                             *)local_108,&key->id);
      pvVar4 = nlohmann::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                           *)pvVar4,"taints");
      vVar1 = pvVar4->m_type;
      pvVar4->m_type = local_f8;
      jVar3 = pvVar4->m_value;
      (pvVar4->m_value).object = (object_t *)local_f0;
      local_f8 = vVar1;
      local_f0 = jVar3;
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::json_value::destroy((json_value *)&local_f0.boolean,vVar1);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_58);
      key = key + 1;
    } while (key != local_60);
  }
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                *)local_40,
               (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                *)local_108);
  pvVar4 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       *)this,"result");
  pvVar4 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       *)pvVar4,"datasets");
  vVar1 = pvVar4->m_type;
  pvVar4->m_type = local_40[0];
  jVar3 = pvVar4->m_value;
  pvVar4->m_value = local_38;
  local_40[0] = vVar1;
  local_38 = jVar3;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::json_value::destroy((json_value *)(local_40 + 8),vVar1);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::json_value::destroy((json_value *)(local_108 + 8),local_108[0]);
  RVar6.content.m_value.object = extraout_RDX.object;
  RVar6.content._0_8_ = this;
  return (Response)RVar6.content;
}

Assistant:

Response Response::topology(const std::vector<DatasetEntry> &datasets) {
    Response r("topology");
    json datasets_json = std::map<std::string, std::string>{};
    for (auto &dataset : datasets) {
        std::vector<std::string> indexes;
        for (auto &index : dataset.indexes) {
            std::string type_name = get_index_type_name(index.type);
            json index_entry;
            index_entry["type"] = type_name;
            index_entry["size"] = index.size;
            datasets_json[dataset.id]["indexes"].push_back(index_entry);
        }
        datasets_json[dataset.id]["size"] = dataset.size;
        datasets_json[dataset.id]["file_count"] = dataset.file_count;
        datasets_json[dataset.id]["taints"] = dataset.taints;
    }
    r.content["result"]["datasets"] = datasets_json;
    return r;
}